

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_test.cpp
# Opt level: O2

int main(void)

{
  bool bVar1;
  bool bVar2;
  Example clone_universe;
  Example universe;
  Example EStack_118;
  Example local_90;
  
  Example::Example(&local_90);
  Example::initializeUniverse(&local_90);
  bVar1 = Example::unittest(&local_90);
  Example::Example(&EStack_118);
  CloneUniverse(&local_90,&EStack_118);
  bVar2 = Example::unittest(&EStack_118);
  Example::~Example(&EStack_118);
  Example::~Example(&local_90);
  return (uint)(!bVar1 || !bVar2);
}

Assistant:

int main()
{
#ifdef ENABLE_SIGFPE
  feenableexcept(FE_ALL_EXCEPT & ~FE_INEXACT);
#endif
  Example universe;
  universe.initializeUniverse();
  bool success = universe.unittest();
  {
    Example clone_universe;
    CloneUniverse(universe, clone_universe);
    success = clone_universe.unittest() && success;
  }
  return (success ? 0 : 1);
}